

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O0

void puppup::movegen::makeMove(State *state,Rack *rack,Rack *population,Move *mov,Gaddag *gaddag)

{
  long lVar1;
  value_type vVar2;
  bool bVar3;
  vector<long,_std::allocator<long>_> *this;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  size_type *psVar8;
  size_type local_78;
  chr c_1;
  idx blank_cursor;
  idx blanks;
  chr c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<long,_std::allocator<long>_> *__range2;
  idx cursor;
  vector<long,_std::allocator<long>_> *s;
  Gaddag *gaddag_local;
  Move *mov_local;
  Rack *population_local;
  Rack *rack_local;
  State *state_local;
  
  if (mov->word != -1) {
    this = trie::Gaddag::getStringFromWord(gaddag,mov->word);
    lVar1 = mov->cursor;
    sVar4 = std::vector<long,_std::allocator<long>_>::size(this);
    __range2 = (vector<long,_std::allocator<long>_> *)(lVar1 - sVar4 * mov->step);
    __end2 = std::vector<long,_std::allocator<long>_>::begin(this);
    c = (chr)std::vector<long,_std::allocator<long>_>::end(this);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                       *)&c), bVar3) {
      psVar8 = (size_type *)
               __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
               ::operator*(&__end2);
      sVar4 = *psVar8;
      pvVar6 = std::array<long,_256UL>::operator[](&state->board,(size_type)__range2);
      if (*pvVar6 == 0x1b) {
        psVar8 = (size_type *)std::array<long,_256UL>::operator[](&state->board,(size_type)__range2)
        ;
        *psVar8 = sVar4;
        pvVar5 = std::array<long,_32UL>::operator[]((array<long,_32UL> *)scores,sVar4);
        vVar2 = *pvVar5;
        pvVar6 = std::array<long,_256UL>::operator[](&state->letter_score,(size_type)__range2);
        *pvVar6 = vVar2;
        pvVar7 = std::array<long,_32UL>::operator[](rack,sVar4);
        *pvVar7 = *pvVar7 + -1;
      }
      __range2 = (vector<long,_std::allocator<long>_> *)
                 ((long)&(__range2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start + mov->step);
      __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
      operator++(&__end2);
    }
    blank_cursor = mov->blanks;
    while (blank_cursor != 0) {
      sVar4 = (blank_cursor & 0xffffU) - 1;
      blank_cursor = blank_cursor >> 0x10;
      pvVar6 = std::array<long,_256UL>::operator[](&state->letter_score,sVar4);
      *pvVar6 = 0;
      pvVar7 = std::array<long,_32UL>::operator[](rack,0x1a);
      *pvVar7 = *pvVar7 + -1;
      psVar8 = (size_type *)std::array<long,_256UL>::operator[](&state->board,sVar4);
      pvVar7 = std::array<long,_32UL>::operator[](rack,*psVar8);
      *pvVar7 = *pvVar7 + 1;
    }
    for (local_78 = 0; (long)local_78 < 0x20; local_78 = local_78 + 1) {
      pvVar7 = std::array<long,_32UL>::operator[](rack,local_78);
      if (*pvVar7 < 0) {
        pvVar7 = std::array<long,_32UL>::operator[](rack,local_78);
        lVar1 = *pvVar7;
        pvVar7 = std::array<long,_32UL>::operator[](population,local_78);
        *pvVar7 = lVar1 + *pvVar7;
        pvVar7 = std::array<long,_32UL>::operator[](rack,local_78);
        *pvVar7 = 0;
      }
    }
    state->score = mov->score + state->score;
  }
  return;
}

Assistant:

inline void makeMove(board::State& state, Rack& rack, Rack& population,
                     const Move& mov, const trie::Gaddag& gaddag) {
    if (mov.word == -1) {
        return;
    }
    const auto& s = gaddag.getStringFromWord(mov.word);
    idx cursor = mov.cursor - s.size() * mov.step;

    for (const chr c : s) {
        if (state.board[cursor] == emptiness) {
            state.board[cursor] = c;
            state.letter_score[cursor] = scores[c];
            rack[c]--;
        }
        cursor += mov.step;
    }
    idx blanks = mov.blanks;
    while (blanks) {
        idx blank_cursor = (blanks & idx(0xffffLL)) - 1;
        blanks >>= idx(16LL);
        state.letter_score[blank_cursor] = 0;
        --rack[blank];
        ++rack[state.board[blank_cursor]];
    }
    for (chr c = 0; c < 32; ++c) {
        if (rack[c] < 0) {
            population[c] += rack[c];
            rack[c] = 0;
        }
    }
    state.score += mov.score;
}